

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall
tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
          (ConstPixelBufferAccess *this,TextureLevel *level)

{
  this->m_format = level->m_format;
  Vector<int,_3>::Vector(&this->m_size,&level->m_size);
  calculatePackedPitch((tcu *)&this->m_pitch,&this->m_format,&this->m_size);
  this->m_data = (level->m_data).m_ptr;
  return;
}

Assistant:

ConstPixelBufferAccess::ConstPixelBufferAccess (const TextureLevel& level)
	: m_format		(level.getFormat())
	, m_size		(level.getSize())
	, m_pitch		(calculatePackedPitch(m_format, m_size))
	, m_data		((void*)level.getPtr())
{
}